

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDiscardTests.cpp
# Opt level: O1

int __thiscall
vkt::sr::anon_unknown_0::ShaderDiscardTests::init(ShaderDiscardTests *this,EVP_PKEY_CTX *ctx)

{
  string *psVar1;
  int iVar2;
  ShaderRenderCase *node;
  _Alloc_hider __s;
  _Alloc_hider __s_00;
  _Alloc_hider __s_01;
  mapped_type *pmVar3;
  long *plVar4;
  UniformSetup *this_00;
  size_type *psVar5;
  ulong uVar6;
  char *pcVar7;
  code *evalFunc;
  key_type local_158;
  uint local_138;
  allocator<char> local_132;
  allocator<char> local_131;
  ulong local_130;
  string local_128;
  long local_108;
  long local_100;
  ShaderRenderCase *local_f8;
  string name;
  string description;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  string local_80;
  TestNode *local_60;
  TestContext *local_58;
  StringTemplate shaderTemplate;
  
  local_138 = 0;
  local_60 = (TestNode *)this;
  do {
    local_108 = (ulong)local_138 << 2;
    local_100 = 0;
    uVar6 = 0xffffffff;
    do {
      if (local_138 < 5) {
        pcVar7 = &DAT_00b48574 + *(int *)(&DAT_00b48574 + local_108);
      }
      else {
        pcVar7 = (char *)0x0;
      }
      local_58 = ((TestNode *)this)->m_testCtx;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&params,pcVar7,(allocator<char> *)&local_158);
      tcu::StringTemplate::StringTemplate(&shaderTemplate,(string *)&params);
      if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
          &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)params._M_t._M_impl._0_8_,
                        (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      local_130 = (ulong)((int)uVar6 + 1);
      params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &params._M_t._M_impl.super__Rb_tree_header._M_header;
      params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      switch(local_130) {
      case 0:
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        local_158.field_2._M_allocated_capacity = 0x44524143534944;
        local_158._M_string_length = 7;
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&params,&local_158);
        std::__cxx11::string::_M_replace((ulong)pmVar3,0,(char *)pmVar3->_M_string_length,0xb48613);
        break;
      case 1:
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        local_158.field_2._M_allocated_capacity = 0x44524143534944;
        local_158._M_string_length = 7;
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&params,&local_158);
        std::__cxx11::string::_M_replace((ulong)pmVar3,0,(char *)pmVar3->_M_string_length,0xb485f0);
        break;
      case 2:
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        local_158.field_2._M_allocated_capacity = 0x44524143534944;
        local_158._M_string_length = 7;
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&params,&local_158);
        std::__cxx11::string::_M_replace((ulong)pmVar3,0,(char *)pmVar3->_M_string_length,0xb48603);
        break;
      case 3:
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        local_158.field_2._M_allocated_capacity = 0x44524143534944;
        local_158._M_string_length = 7;
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&params,&local_158);
        std::__cxx11::string::_M_replace((ulong)pmVar3,0,(char *)pmVar3->_M_string_length,0xb4861b);
        break;
      case 4:
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        local_158.field_2._M_allocated_capacity = 0x44524143534944;
        local_158._M_string_length = 7;
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&params,&local_158);
        std::__cxx11::string::_M_replace((ulong)pmVar3,0,(char *)pmVar3->_M_string_length,0xb48644);
        break;
      default:
        goto switchD_005ac07b_default;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
switchD_005ac07b_default:
      if (local_138 < 5) {
        pcVar7 = &DAT_00b48588 + *(int *)(&DAT_00b48588 + local_108);
      }
      else {
        pcVar7 = (char *)0x0;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,pcVar7,(allocator<char> *)&description);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_128);
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      psVar5 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_158.field_2._M_allocated_capacity = *psVar5;
        local_158.field_2._8_8_ = plVar4[3];
      }
      else {
        local_158.field_2._M_allocated_capacity = *psVar5;
        local_158._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_158._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_158);
      psVar5 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar5) {
        name.field_2._M_allocated_capacity = *psVar5;
        name.field_2._8_8_ = plVar4[3];
        name._M_dataplus._M_p = (pointer)&name.field_2;
      }
      else {
        name.field_2._M_allocated_capacity = *psVar5;
        name._M_dataplus._M_p = (pointer)*plVar4;
      }
      name._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if ((uint)local_130 < 5) {
        pcVar7 = &DAT_00b485b0 + *(int *)(&DAT_00b485b0 + local_100);
      }
      else {
        pcVar7 = (char *)0x0;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,pcVar7,(allocator<char> *)&local_80);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_128);
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      psVar5 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_158.field_2._M_allocated_capacity = *psVar5;
        local_158.field_2._8_8_ = plVar4[3];
      }
      else {
        local_158.field_2._M_allocated_capacity = *psVar5;
        local_158._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_158._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_158);
      description._M_dataplus._M_p = (pointer)&description.field_2;
      psVar5 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar5) {
        description.field_2._M_allocated_capacity = *psVar5;
        description.field_2._8_8_ = plVar4[3];
      }
      else {
        description.field_2._M_allocated_capacity = *psVar5;
        description._M_dataplus._M_p = (pointer)*plVar4;
      }
      description._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      local_f8 = (ShaderRenderCase *)operator_new(0xe8);
      __s_00 = description._M_dataplus;
      __s = name._M_dataplus;
      tcu::StringTemplate::specialize(&local_80,&shaderTemplate,&params);
      __s_01._M_p = local_80._M_dataplus._M_p;
      iVar2 = (int)local_130;
      evalFunc = evalDiscardAlways;
      if (iVar2 - 1U < 4) {
        evalFunc = (code *)(&PTR_evalDiscardNever_00d5ae88)[uVar6 & 0xffffffff];
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,__s._M_p,&local_131);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,__s_00._M_p,&local_132);
      this_00 = (UniformSetup *)operator_new(0x18);
      UniformSetup::UniformSetup(this_00);
      this_00->_vptr_UniformSetup = (_func_int **)&PTR__UniformSetup_00d5adf8;
      *(bool *)&this_00[1]._vptr_UniformSetup = iVar2 == 4;
      ShaderRenderCase::ShaderRenderCase
                (local_f8,local_58,&local_158,&local_128,false,evalFunc,this_00,
                 (AttributeSetupFunc)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      node = local_f8;
      (local_f8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ShaderRenderCase_00d5ad98;
      *(bool *)&local_f8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = iVar2 == 4
      ;
      psVar1 = &local_f8->m_fragShaderSource;
      pcVar7 = (char *)(local_f8->m_fragShaderSource)._M_string_length;
      strlen(__s_01._M_p);
      std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar7,(ulong)__s_01._M_p);
      std::__cxx11::string::_M_replace
                ((ulong)&node->m_vertShaderSource,0,
                 (char *)(node->m_vertShaderSource)._M_string_length,0xb48f7c);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      this = (ShaderDiscardTests *)local_60;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)description._M_dataplus._M_p != &description.field_2) {
        operator_delete(description._M_dataplus._M_p,description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&params._M_t);
      tcu::StringTemplate::~StringTemplate(&shaderTemplate);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)node);
      local_100 = local_100 + 4;
      uVar6 = local_130;
    } while (iVar2 != 4);
    local_138 = local_138 + 1;
    if (local_138 == 5) {
      return 5;
    }
  } while( true );
}

Assistant:

void ShaderDiscardTests::init (void)
{
	for (int tmpl = 0; tmpl < DISCARDTEMPLATE_LAST; tmpl++)
		for (int mode = 0; mode < DISCARDMODE_LAST; mode++)
			addChild(makeDiscardCase(m_testCtx, (DiscardTemplate)tmpl, (DiscardMode)mode).release());
}